

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

void __thiscall duckdb_parquet::AesGcmCtrV1::AesGcmCtrV1(AesGcmCtrV1 *this)

{
  *(undefined ***)this = &PTR__AesGcmCtrV1_024771d8;
  (this->aad_prefix)._M_dataplus._M_p = (pointer)&(this->aad_prefix).field_2;
  (this->aad_prefix)._M_string_length = 0;
  (this->aad_prefix).field_2._M_local_buf[0] = '\0';
  (this->aad_file_unique)._M_dataplus._M_p = (pointer)&(this->aad_file_unique).field_2;
  (this->aad_file_unique)._M_string_length = 0;
  (this->aad_file_unique).field_2._M_local_buf[0] = '\0';
  this->supply_aad_prefix = false;
  this->__isset = (_AesGcmCtrV1__isset)((byte)this->__isset & 0xf8);
  return;
}

Assistant:

AesGcmCtrV1::AesGcmCtrV1() noexcept
   : aad_prefix(),
     aad_file_unique(),
     supply_aad_prefix(0) {
}